

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffptdmll(fitsfile *fptr,int colnum,int naxis,LONGLONG *naxes,int *status)

{
  tcolumn *ptVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  ulong uVar5;
  long lVar6;
  LONGLONG repeat;
  char tdimstr [71];
  char keyname [75];
  char value [80];
  char comm [73];
  long local_180;
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (colnum - 1000U < 0xfffffc19) {
    ffpmsg("column number is out of range 1 - 999 (ffptdm)");
    *status = 0x12e;
    return 0x12e;
  }
  if (naxis < 1) {
    ffpmsg("naxis is less than 1 (ffptdm)");
    *status = 0x140;
    return 0x140;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2))
    goto LAB_001f5bc8;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (fptr->Fptr->hdutype != 2) {
    ffpmsg("Error: The TDIMn keyword is only allowed in BINTABLE extensions (ffptdm)");
    *status = 0xe3;
    return 0xe3;
  }
  local_178[0] = '(';
  local_178[1] = '\0';
  lVar6 = 1;
  uVar5 = 0;
  do {
    if (uVar5 != 0) {
      sVar3 = strlen(local_178);
      (local_178 + sVar3)[0] = ',';
      (local_178 + sVar3)[1] = '\0';
    }
    if (naxes[uVar5] < 0) {
      __s = "one or more TDIM values are less than 0 (ffptdm)";
      goto LAB_001f5bf5;
    }
    snprintf(local_d8,0x50,"%.0f",SUB84((double)naxes[uVar5],0));
    sVar3 = strlen(local_178);
    sVar4 = strlen(local_d8);
    if ((sVar4 + sVar3) - 0x46 < 0xffffffffffffffb9) {
      __s = "TDIM string too long (ffptdmll)";
      goto LAB_001f5bf5;
    }
    strcat(local_178,local_d8);
    lVar6 = lVar6 * naxes[uVar5];
    uVar5 = uVar5 + 1;
  } while ((uint)naxis != uVar5);
  ptVar1 = fptr->Fptr->tableptr;
  if (ptVar1[(ulong)(uint)colnum - 1].trepeat != lVar6) {
    ffkeyn("TFORM",colnum,local_128,status);
    ffgkys(fptr,local_128,local_d8,(char *)0x0,status);
    ffbnfmll(local_d8,(int *)0x0,&local_180,(long *)0x0,status);
    if ((0 < *status) || (local_180 != lVar6)) {
      __s = local_88;
      snprintf(__s,0x51,"column vector length, %.0f, does not equal TDIMn array size, %.0f",
               SUB84((double)ptVar1[(ulong)(uint)colnum - 1].trepeat,0),(double)lVar6);
LAB_001f5bf5:
      ffpmsg(__s);
      *status = 0x107;
      return 0x107;
    }
  }
  sVar3 = strlen(local_178);
  (local_178 + sVar3)[0] = ')';
  (local_178 + sVar3)[1] = '\0';
  builtin_strncpy(local_88,"size of the multidimensional array",0x23);
  ffkeyn("TDIM",colnum,local_128,status);
  ffpkys(fptr,local_128,local_178,local_88,status);
LAB_001f5bc8:
  return *status;
}

Assistant:

int ffptdmll( fitsfile *fptr, /* I - FITS file pointer                      */
            int colnum,     /* I - column number                            */
            int naxis,      /* I - number of axes in the data array         */
            LONGLONG naxes[], /* I - length of each data axis               */
            int *status)    /* IO - error status                            */
/*
  write the TDIMnnn keyword describing the dimensionality of a column
*/
{
    char keyname[FLEN_KEYWORD], tdimstr[FLEN_VALUE], comm[FLEN_COMMENT];
    char value[80], message[81];
    int ii;
    LONGLONG totalpix = 1, repeat;
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (colnum < 1 || colnum > 999)
    {
        ffpmsg("column number is out of range 1 - 999 (ffptdm)");
        return(*status = BAD_COL_NUM);
    }

    if (naxis < 1)
    {
        ffpmsg("naxis is less than 1 (ffptdm)");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ( (fptr->Fptr)->hdutype != BINARY_TBL)
    {
       ffpmsg(
    "Error: The TDIMn keyword is only allowed in BINTABLE extensions (ffptdm)");
       return(*status = NOT_BTABLE);
    }

    strcpy(tdimstr, "(");            /* start constructing the TDIM value */   

    for (ii = 0; ii < naxis; ii++)
    {
        if (ii > 0)
            strcat(tdimstr, ",");   /* append the comma separator */

        if (naxes[ii] < 0)
        {
            ffpmsg("one or more TDIM values are less than 0 (ffptdm)");
            return(*status = BAD_TDIM);
        }

        /* cast to double because the 64-bit int conversion character in */
        /* sprintf is platform dependent ( %lld, %ld, %I64d )            */

        snprintf(value, 80, "%.0f", (double) naxes[ii]);
        
        if (strlen(tdimstr)+strlen(value)+1 > FLEN_VALUE-1)
        {
            ffpmsg("TDIM string too long (ffptdmll)");
            return(*status = BAD_TDIM);
        }
        strcat(tdimstr, value);     /* append the axis size */

        totalpix *= naxes[ii];
    }

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);      /* point to the specified column number */

    if ( colptr->trepeat != totalpix)
    {
      /* There is an apparent inconsistency between TDIMn and TFORMn. */
      /* The colptr->trepeat value may be out of date, so re-read     */
      /* the TFORMn keyword to be sure.                               */

      ffkeyn("TFORM", colnum, keyname, status);   /* construct TFORMn name  */
      ffgkys(fptr, keyname, value, NULL, status); /* read TFORMn keyword    */
      ffbnfmll(value, NULL, &repeat, NULL, status); /* parse the repeat count */

      if (*status > 0 || repeat != totalpix)
      {
        snprintf(message,FLEN_ERRMSG,
        "column vector length, %.0f, does not equal TDIMn array size, %.0f",
        (double) (colptr->trepeat), (double) totalpix);
        ffpmsg(message);
        return(*status = BAD_TDIM);
      }
    }

    strcat(tdimstr, ")" );            /* append the closing parenthesis */

    strcpy(comm, "size of the multidimensional array");
    ffkeyn("TDIM", colnum, keyname, status);      /* construct TDIMn name */
    ffpkys(fptr, keyname, tdimstr, comm, status);  /* write the keyword */
    return(*status);
}